

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst4_w4_sse2(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long in_RSI;
  undefined8 *in_RDI;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  __m128i out0;
  int i;
  __m128i rounding;
  __m128i x2 [4];
  __m128i x1 [8];
  __m128i u [2];
  __m128i x0 [4];
  __m128i sinpi_m03_m01;
  __m128i sinpi_p04_p02;
  __m128i sinpi_0_p03;
  __m128i sinpi_p03_m03;
  __m128i sinpi_p03_m04;
  __m128i sinpi_p03_p02;
  __m128i sinpi_p02_m01;
  __m128i sinpi_p01_p04;
  int32_t *sinpi;
  int local_53c;
  int local_528 [2];
  undefined8 uStack_520;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  int local_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  int32_t *local_388;
  long local_380;
  undefined8 *local_378;
  undefined4 local_36c;
  int local_368;
  uint local_364;
  int local_360;
  int local_35c;
  int local_358;
  uint local_354;
  int local_350;
  uint local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_380 = in_RSI;
  local_378 = in_RDI;
  local_388 = sinpi_arr(0xc);
  local_34c = (uint)*(ushort *)(local_388 + 1) | local_388[4] << 0x10;
  local_10c = local_34c;
  local_110 = local_34c;
  local_114 = local_34c;
  local_118 = local_34c;
  local_128 = CONCAT44(local_34c,local_34c);
  uStack_120 = CONCAT44(local_34c,local_34c);
  local_398 = local_128;
  uStack_390 = uStack_120;
  local_350 = (uint)*(ushort *)(local_388 + 2) + local_388[1] * -0x10000;
  local_ec = local_350;
  local_f0 = local_350;
  local_f4 = local_350;
  local_f8 = local_350;
  local_108 = CONCAT44(local_350,local_350);
  uStack_100 = CONCAT44(local_350,local_350);
  local_3a8 = local_108;
  uStack_3a0 = uStack_100;
  local_354 = (uint)*(ushort *)(local_388 + 3) | local_388[2] << 0x10;
  local_cc = local_354;
  local_d0 = local_354;
  local_d4 = local_354;
  local_d8 = local_354;
  local_e8 = CONCAT44(local_354,local_354);
  uStack_e0 = CONCAT44(local_354,local_354);
  local_3b8 = local_e8;
  uStack_3b0 = uStack_e0;
  local_358 = (uint)*(ushort *)(local_388 + 3) + local_388[4] * -0x10000;
  local_ac = local_358;
  local_b0 = local_358;
  local_b4 = local_358;
  local_b8 = local_358;
  local_c8 = CONCAT44(local_358,local_358);
  uStack_c0 = CONCAT44(local_358,local_358);
  local_3c8 = local_c8;
  uStack_3c0 = uStack_c0;
  local_35c = (local_388[3] & 0xffffU) + local_388[3] * -0x10000;
  local_8c = local_35c;
  local_90 = local_35c;
  local_94 = local_35c;
  local_98 = local_35c;
  local_a8 = CONCAT44(local_35c,local_35c);
  uStack_a0 = CONCAT44(local_35c,local_35c);
  local_3d8 = local_a8;
  uStack_3d0 = uStack_a0;
  local_360 = local_388[3] << 0x10;
  local_6c = local_360;
  local_70 = local_360;
  local_74 = local_360;
  local_78 = local_360;
  local_88 = CONCAT44(local_360,local_360);
  uStack_80 = CONCAT44(local_360,local_360);
  local_3e8 = local_88;
  uStack_3e0 = uStack_80;
  local_364 = (uint)*(ushort *)(local_388 + 4) | local_388[2] << 0x10;
  local_4c = local_364;
  local_50 = local_364;
  local_54 = local_364;
  local_58 = local_364;
  local_68 = CONCAT44(local_364,local_364);
  uStack_60 = CONCAT44(local_364,local_364);
  local_3f8 = local_68;
  uStack_3f0 = uStack_60;
  local_368 = (-local_388[3] & 0xffffU) + local_388[1] * -0x10000;
  local_2c = local_368;
  local_30 = local_368;
  local_34 = local_368;
  local_38 = local_368;
  local_48 = CONCAT44(local_368,local_368);
  uStack_40 = CONCAT44(local_368,local_368);
  local_408 = local_48;
  uStack_400 = uStack_40;
  local_448 = *local_378;
  uStack_440 = local_378[1];
  local_438 = local_378[2];
  uStack_430 = local_378[3];
  local_428 = local_378[4];
  uStack_420 = local_378[5];
  local_418 = local_378[6];
  uStack_410 = local_378[7];
  local_318 = local_448;
  uStack_310 = local_378[1];
  local_328 = local_428;
  uStack_320 = local_378[5];
  local_318._0_2_ = (undefined2)local_448;
  local_318._2_2_ = (undefined2)((ulong)local_448 >> 0x10);
  local_318._4_2_ = (undefined2)((ulong)local_448 >> 0x20);
  local_318._6_2_ = (undefined2)((ulong)local_448 >> 0x30);
  local_328._0_2_ = (undefined2)local_428;
  local_328._2_2_ = (undefined2)((ulong)local_428 >> 0x10);
  local_328._4_2_ = (undefined2)((ulong)local_428 >> 0x20);
  local_328._6_2_ = (undefined2)((ulong)local_428 >> 0x30);
  local_468 = (undefined2)local_318;
  uStack_466 = (undefined2)local_328;
  uStack_464 = local_318._2_2_;
  uStack_462 = local_328._2_2_;
  uStack_460 = local_318._4_2_;
  uStack_45e = local_328._4_2_;
  uStack_45c = local_318._6_2_;
  uStack_45a = local_328._6_2_;
  local_338 = local_438;
  uStack_330 = local_378[3];
  local_348 = local_418;
  uStack_340 = local_378[7];
  local_338._0_2_ = (undefined2)local_438;
  local_338._2_2_ = (undefined2)((ulong)local_438 >> 0x10);
  local_338._4_2_ = (undefined2)((ulong)local_438 >> 0x20);
  local_338._6_2_ = (undefined2)((ulong)local_438 >> 0x30);
  local_348._0_2_ = (undefined2)local_418;
  local_348._2_2_ = (undefined2)((ulong)local_418 >> 0x10);
  local_348._4_2_ = (undefined2)((ulong)local_418 >> 0x20);
  local_348._6_2_ = (undefined2)((ulong)local_418 >> 0x30);
  local_458 = (undefined2)local_338;
  uStack_456 = (undefined2)local_348;
  uStack_454 = local_338._2_2_;
  uStack_452 = local_348._2_2_;
  uStack_450 = local_338._4_2_;
  uStack_44e = local_348._4_2_;
  uStack_44c = local_338._6_2_;
  uStack_44a = local_348._6_2_;
  local_218 = CONCAT26(local_328._2_2_,
                       CONCAT24(local_318._2_2_,
                                CONCAT22((undefined2)local_328,(undefined2)local_318)));
  uStack_210 = CONCAT26(local_328._6_2_,
                        CONCAT24(local_318._6_2_,CONCAT22(local_328._4_2_,local_318._4_2_)));
  local_228 = local_128;
  uStack_220 = uStack_120;
  auVar15._8_8_ = uStack_210;
  auVar15._0_8_ = local_218;
  auVar14._8_8_ = uStack_120;
  auVar14._0_8_ = local_128;
  local_4e8 = pmaddwd(auVar15,auVar14);
  local_238 = CONCAT26(local_328._2_2_,
                       CONCAT24(local_318._2_2_,
                                CONCAT22((undefined2)local_328,(undefined2)local_318)));
  uStack_230 = CONCAT26(local_328._6_2_,
                        CONCAT24(local_318._6_2_,CONCAT22(local_328._4_2_,local_318._4_2_)));
  local_248 = local_108;
  uStack_240 = uStack_100;
  auVar13._8_8_ = uStack_230;
  auVar13._0_8_ = local_238;
  auVar12._8_8_ = uStack_100;
  auVar12._0_8_ = local_108;
  local_4d8 = pmaddwd(auVar13,auVar12);
  local_258 = CONCAT26(local_348._2_2_,
                       CONCAT24(local_338._2_2_,
                                CONCAT22((undefined2)local_348,(undefined2)local_338)));
  uStack_250 = CONCAT26(local_348._6_2_,
                        CONCAT24(local_338._6_2_,CONCAT22(local_348._4_2_,local_338._4_2_)));
  local_268 = local_e8;
  uStack_260 = uStack_e0;
  auVar11._8_8_ = uStack_250;
  auVar11._0_8_ = local_258;
  auVar10._8_8_ = uStack_e0;
  auVar10._0_8_ = local_e8;
  local_4c8 = pmaddwd(auVar11,auVar10);
  local_278 = CONCAT26(local_348._2_2_,
                       CONCAT24(local_338._2_2_,
                                CONCAT22((undefined2)local_348,(undefined2)local_338)));
  uStack_270 = CONCAT26(local_348._6_2_,
                        CONCAT24(local_338._6_2_,CONCAT22(local_348._4_2_,local_338._4_2_)));
  local_288 = local_c8;
  uStack_280 = uStack_c0;
  auVar9._8_8_ = uStack_270;
  auVar9._0_8_ = local_278;
  auVar8._8_8_ = uStack_c0;
  auVar8._0_8_ = local_c8;
  local_4b8 = pmaddwd(auVar9,auVar8);
  local_298 = CONCAT26(local_328._2_2_,
                       CONCAT24(local_318._2_2_,
                                CONCAT22((undefined2)local_328,(undefined2)local_318)));
  uStack_290 = CONCAT26(local_328._6_2_,
                        CONCAT24(local_318._6_2_,CONCAT22(local_328._4_2_,local_318._4_2_)));
  local_2a8 = local_a8;
  uStack_2a0 = uStack_a0;
  auVar7._8_8_ = uStack_290;
  auVar7._0_8_ = local_298;
  auVar6._8_8_ = uStack_a0;
  auVar6._0_8_ = local_a8;
  local_4a8 = pmaddwd(auVar7,auVar6);
  local_2b8 = CONCAT26(local_348._2_2_,
                       CONCAT24(local_338._2_2_,
                                CONCAT22((undefined2)local_348,(undefined2)local_338)));
  uStack_2b0 = CONCAT26(local_348._6_2_,
                        CONCAT24(local_338._6_2_,CONCAT22(local_348._4_2_,local_338._4_2_)));
  local_2c8 = local_88;
  uStack_2c0 = uStack_80;
  auVar5._8_8_ = uStack_2b0;
  auVar5._0_8_ = local_2b8;
  auVar4._8_8_ = uStack_80;
  auVar4._0_8_ = local_88;
  local_498 = pmaddwd(auVar5,auVar4);
  local_2d8 = CONCAT26(local_328._2_2_,
                       CONCAT24(local_318._2_2_,
                                CONCAT22((undefined2)local_328,(undefined2)local_318)));
  uStack_2d0 = CONCAT26(local_328._6_2_,
                        CONCAT24(local_318._6_2_,CONCAT22(local_328._4_2_,local_318._4_2_)));
  local_2e8 = local_68;
  uStack_2e0 = uStack_60;
  auVar3._8_8_ = uStack_2d0;
  auVar3._0_8_ = local_2d8;
  auVar2._8_8_ = uStack_60;
  auVar2._0_8_ = local_68;
  local_488 = pmaddwd(auVar3,auVar2);
  local_2f8 = CONCAT26(local_348._2_2_,
                       CONCAT24(local_338._2_2_,
                                CONCAT22((undefined2)local_348,(undefined2)local_338)));
  uStack_2f0 = CONCAT26(local_348._6_2_,
                        CONCAT24(local_338._6_2_,CONCAT22(local_348._4_2_,local_338._4_2_)));
  local_308 = local_48;
  uStack_300 = uStack_40;
  auVar1._8_8_ = uStack_2f0;
  auVar1._0_8_ = local_2f8;
  auVar22._8_8_ = uStack_40;
  auVar22._0_8_ = local_48;
  local_478 = pmaddwd(auVar1,auVar22);
  local_178 = local_4e8._0_8_;
  uStack_170 = local_4e8._8_8_;
  local_188 = local_4c8._0_8_;
  uStack_180 = local_4c8._8_8_;
  local_178._0_4_ = local_4e8._0_4_;
  local_178._4_4_ = local_4e8._4_4_;
  uStack_170._0_4_ = local_4e8._8_4_;
  uStack_170._4_4_ = local_4e8._12_4_;
  local_188._0_4_ = local_4c8._0_4_;
  local_188._4_4_ = local_4c8._4_4_;
  uStack_180._0_4_ = local_4c8._8_4_;
  uStack_180._4_4_ = local_4c8._12_4_;
  local_528[0] = (int)local_178 + (int)local_188;
  local_528[1] = local_178._4_4_ + local_188._4_4_;
  uStack_520._0_4_ = (int)uStack_170 + (int)uStack_180;
  uStack_520._4_4_ = uStack_170._4_4_ + uStack_180._4_4_;
  local_198 = local_4d8._0_8_;
  uStack_190 = local_4d8._8_8_;
  local_1a8 = local_4b8._0_8_;
  uStack_1a0 = local_4b8._8_8_;
  local_198._0_4_ = local_4d8._0_4_;
  local_198._4_4_ = local_4d8._4_4_;
  uStack_190._0_4_ = local_4d8._8_4_;
  uStack_190._4_4_ = local_4d8._12_4_;
  local_1a8._0_4_ = local_4b8._0_4_;
  local_1a8._4_4_ = local_4b8._4_4_;
  uStack_1a0._0_4_ = local_4b8._8_4_;
  uStack_1a0._4_4_ = local_4b8._12_4_;
  local_518 = (int)local_198 + (int)local_1a8;
  iStack_514 = local_198._4_4_ + local_1a8._4_4_;
  iStack_510 = (int)uStack_190 + (int)uStack_1a0;
  iStack_50c = uStack_190._4_4_ + uStack_1a0._4_4_;
  local_1b8 = local_4a8._0_8_;
  uStack_1b0 = local_4a8._8_8_;
  local_1c8 = local_498._0_8_;
  uStack_1c0 = local_498._8_8_;
  local_1b8._0_4_ = local_4a8._0_4_;
  local_1b8._4_4_ = local_4a8._4_4_;
  uStack_1b0._0_4_ = local_4a8._8_4_;
  uStack_1b0._4_4_ = local_4a8._12_4_;
  local_1c8._0_4_ = local_498._0_4_;
  local_1c8._4_4_ = local_498._4_4_;
  uStack_1c0._0_4_ = local_498._8_4_;
  uStack_1c0._4_4_ = local_498._12_4_;
  local_508 = (int)local_1b8 + (int)local_1c8;
  iStack_504 = local_1b8._4_4_ + local_1c8._4_4_;
  iStack_500 = (int)uStack_1b0 + (int)uStack_1c0;
  iStack_4fc = uStack_1b0._4_4_ + uStack_1c0._4_4_;
  local_1d8 = local_488._0_8_;
  uStack_1d0 = local_488._8_8_;
  local_1e8 = local_478._0_8_;
  uStack_1e0 = local_478._8_8_;
  local_1d8._0_4_ = local_488._0_4_;
  local_1d8._4_4_ = local_488._4_4_;
  uStack_1d0._0_4_ = local_488._8_4_;
  uStack_1d0._4_4_ = local_488._12_4_;
  local_1e8._0_4_ = local_478._0_4_;
  local_1e8._4_4_ = local_478._4_4_;
  uStack_1e0._0_4_ = local_478._8_4_;
  uStack_1e0._4_4_ = local_478._12_4_;
  local_4f8 = (int)local_1d8 + (int)local_1e8;
  iStack_4f4 = local_1d8._4_4_ + local_1e8._4_4_;
  iStack_4f0 = (int)uStack_1d0 + (int)uStack_1e0;
  iStack_4ec = uStack_1d0._4_4_ + uStack_1e0._4_4_;
  local_36c = 0x800;
  local_4 = 0x800;
  local_8 = 0x800;
  local_c = 0x800;
  local_10 = 0x800;
  local_28 = 0x80000000800;
  uStack_20 = 0x80000000800;
  for (local_53c = 0; local_53c < 4; local_53c = local_53c + 1) {
    local_1f8 = *(undefined8 *)(local_528 + (long)local_53c * 4);
    uStack_1f0 = (&uStack_520)[(long)local_53c * 2];
    local_208 = 0x80000000800;
    uStack_200 = 0x80000000800;
    local_1f8._4_4_ = (int)((ulong)local_1f8 >> 0x20);
    uStack_1f0._4_4_ = (int)((ulong)uStack_1f0 >> 0x20);
    local_158 = CONCAT44(local_1f8._4_4_ + 0x800,(int)local_1f8 + 0x800);
    uStack_150 = CONCAT44(uStack_1f0._4_4_ + 0x800,(int)uStack_1f0 + 0x800);
    local_15c = 0xc;
    auVar22 = ZEXT416(0xc);
    iVar18 = (int)local_1f8 + 0x800 >> auVar22;
    iVar19 = local_1f8._4_4_ + 0x800 >> auVar22;
    iVar20 = (int)uStack_1f0 + 0x800 >> auVar22;
    iVar21 = uStack_1f0._4_4_ + 0x800 >> auVar22;
    local_138 = CONCAT44(iVar19,iVar18);
    uStack_130 = CONCAT44(iVar21,iVar20);
    local_148 = CONCAT44(iVar19,iVar18);
    uStack_140 = CONCAT44(iVar21,iVar20);
    auVar17._8_8_ = uStack_130;
    auVar17._0_8_ = local_138;
    auVar16._8_8_ = uStack_140;
    auVar16._0_8_ = local_148;
    auVar22 = packssdw(auVar17,auVar16);
    *(undefined1 (*) [16])(local_380 + (long)local_53c * 0x10) = auVar22;
  }
  return;
}

Assistant:

static void iadst4_w4_sse2(const __m128i *input, __m128i *output) {
  const int32_t *sinpi = sinpi_arr(INV_COS_BIT);
  const __m128i sinpi_p01_p04 = pair_set_epi16(sinpi[1], sinpi[4]);
  const __m128i sinpi_p02_m01 = pair_set_epi16(sinpi[2], -sinpi[1]);
  const __m128i sinpi_p03_p02 = pair_set_epi16(sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_m04 = pair_set_epi16(sinpi[3], -sinpi[4]);
  const __m128i sinpi_p03_m03 = pair_set_epi16(sinpi[3], -sinpi[3]);
  const __m128i sinpi_0_p03 = pair_set_epi16(0, sinpi[3]);
  const __m128i sinpi_p04_p02 = pair_set_epi16(sinpi[4], sinpi[2]);
  const __m128i sinpi_m03_m01 = pair_set_epi16(-sinpi[3], -sinpi[1]);
  __m128i x0[4];
  x0[0] = input[0];
  x0[1] = input[1];
  x0[2] = input[2];
  x0[3] = input[3];

  __m128i u[2];
  u[0] = _mm_unpacklo_epi16(x0[0], x0[2]);
  u[1] = _mm_unpacklo_epi16(x0[1], x0[3]);

  __m128i x1[8];
  x1[0] = _mm_madd_epi16(u[0], sinpi_p01_p04);  // x0*sin1 + x2*sin4
  x1[1] = _mm_madd_epi16(u[0], sinpi_p02_m01);  // x0*sin2 - x2*sin1
  x1[2] = _mm_madd_epi16(u[1], sinpi_p03_p02);  // x1*sin3 + x3*sin2
  x1[3] = _mm_madd_epi16(u[1], sinpi_p03_m04);  // x1*sin3 - x3*sin4
  x1[4] = _mm_madd_epi16(u[0], sinpi_p03_m03);  // x0*sin3 - x2*sin3
  x1[5] = _mm_madd_epi16(u[1], sinpi_0_p03);    // x2*sin3
  x1[6] = _mm_madd_epi16(u[0], sinpi_p04_p02);  // x0*sin4 + x2*sin2
  x1[7] = _mm_madd_epi16(u[1], sinpi_m03_m01);  // -x1*sin3 - x3*sin1

  __m128i x2[4];
  x2[0] = _mm_add_epi32(x1[0], x1[2]);  // x0*sin1 + x2*sin4 + x1*sin3 + x3*sin2
  x2[1] = _mm_add_epi32(x1[1], x1[3]);  // x0*sin2 - x2*sin1 + x1*sin3 - x3*sin4
  x2[2] = _mm_add_epi32(x1[4], x1[5]);  // x0*sin3 - x2*sin3 + x3*sin3
  x2[3] = _mm_add_epi32(x1[6], x1[7]);  // x0*sin4 + x2*sin2 - x1*sin3 - x3*sin1

  const __m128i rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  for (int i = 0; i < 4; ++i) {
    __m128i out0 = _mm_add_epi32(x2[i], rounding);
    out0 = _mm_srai_epi32(out0, INV_COS_BIT);
    output[i] = _mm_packs_epi32(out0, out0);
  }
}